

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

PrecisionCase *
deqp::gls::BuiltinPrecisionTests::
createFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,3,3>,tcu::Matrix<float,3,3>,tcu::Matrix<float,3,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
          (Context *context,string *name,
          Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *func)

{
  int iVar1;
  Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *func_local;
  string *name_local;
  Context *context_local;
  
  iVar1 = (**(code **)(*(long *)func + 0x28))();
  if (iVar1 == -1) {
    context_local = (Context *)operator_new(0x188);
    FuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ::FuncCase((FuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                *)context_local,context,name,func);
  }
  else if (iVar1 == 1) {
    context_local = (Context *)operator_new(0x188);
    InOutFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ::InOutFuncCase((InOutFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                     *)context_local,context,name,func);
  }
  else {
    context_local = (Context *)0x0;
  }
  return (PrecisionCase *)context_local;
}

Assistant:

PrecisionCase* createFuncCase (const Context&	context,
							   const string&	name,
							   const Func<Sig>&	func)
{
	switch (func.getOutParamIndex())
	{
		case -1:
			return new FuncCase<Sig>(context, name, func);
		case 1:
			return new InOutFuncCase<Sig>(context, name, func);
		default:
			DE_FATAL("Impossible");
	}
	return DE_NULL;
}